

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbolize.cc
# Opt level: O2

int google::OpenObjectFileContainingPcAndGetStartAddress
              (uint64_t pc,uint64_t *start_address,uint64_t *base_address,char *out_file_name,
              size_t out_file_name_size)

{
  size_t sVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int *piVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  Elf64_Addr EVar10;
  char *pcVar11;
  size_t __n;
  ulong uVar12;
  long lVar13;
  char local_548 [8];
  char buf [1024];
  int local_140 [2];
  Elf64_Ehdr ehdr;
  uint64_t file_offset;
  long local_f0;
  LineReader local_c8;
  ulong local_90;
  uint64_t end_address;
  uint64_t local_80;
  size_t local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  size_t *local_58;
  int local_4c;
  size_t *local_48;
  size_t local_40;
  FileDescriptor local_38;
  FileDescriptor local_34;
  FileDescriptor wrapped_maps_fd;
  FileDescriptor wrapped_mem_fd;
  
  local_78 = out_file_name_size;
  local_70 = out_file_name;
  local_48 = start_address;
  do {
    iVar3 = open("/proc/self/maps",0);
    local_38.fd_ = iVar3;
    if (-1 < iVar3) goto LAB_0012937c;
    piVar6 = __errno_location();
  } while (*piVar6 == 4);
  iVar3 = -1;
  goto LAB_001293aa;
  while (piVar6 = __errno_location(), *piVar6 == 4) {
LAB_0012937c:
    iVar4 = open("/proc/self/mem",0);
    local_34.fd_ = iVar4;
    if (-1 < iVar4) {
      pcVar7 = local_548;
      local_40 = 0;
      local_c8.buf_len_ = 0x400;
      local_c8.offset_ = 0;
      pcVar8 = pcVar7;
      local_c8.fd_ = iVar3;
      local_c8.buf_ = pcVar7;
      local_c8.eol_ = pcVar7;
      local_c8.eod_ = pcVar7;
      local_80 = pc;
      local_58 = base_address;
      local_4c = iVar4;
      goto LAB_0012940d;
    }
  }
LAB_0012939d:
  iVar3 = -1;
  goto LAB_001293a1;
LAB_0012940d:
  do {
    if (local_548 == pcVar8) {
      lVar13 = ReadFromOffset(iVar3,local_548,0x400,local_40);
      if (lVar13 < 1) goto LAB_0012939d;
      local_c8.eod_ = local_548 + lVar13;
LAB_001294bf:
      pcVar11 = local_548;
      local_c8.offset_ = local_40 + lVar13;
      local_c8.bol_ = pcVar11;
      local_60 = local_c8.eod_;
      local_40 = local_c8.offset_;
    }
    else {
      pcVar11 = pcVar7 + 1;
      local_c8.bol_ = pcVar11;
      local_60 = pcVar8;
      if (pcVar8 < pcVar11) {
        abort();
      }
      pcVar7 = anon_unknown_3::LineReader::FindLineFeed(&local_c8);
      if (pcVar7 == (char *)0x0) {
        __n = (long)local_60 - (long)pcVar11;
        memmove(local_548,pcVar11,__n);
        lVar13 = ReadFromOffset(iVar3,local_548 + __n,0x400 - __n,local_40);
        if (0 < lVar13) {
          local_c8.eod_ = local_548 + __n + lVar13;
          goto LAB_001294bf;
        }
        goto LAB_0012939d;
      }
    }
    pcVar7 = anon_unknown_3::LineReader::FindLineFeed(&local_c8);
    local_c8.eol_ = pcVar7;
    if (pcVar7 == (char *)0x0) goto LAB_0012939d;
    *pcVar7 = '\0';
    pcVar8 = GetHex(pcVar11,pcVar7,local_48);
    if ((((pcVar8 == pcVar7) || (*pcVar8 != '-')) ||
        (pcVar8 = GetHex(pcVar8 + 1,pcVar7,&local_90), pcVar8 == pcVar7)) || (*pcVar8 != ' '))
    goto LAB_0012939d;
    lVar13 = 0;
    pcVar11 = pcVar8 + 1;
    for (pcVar9 = pcVar11; (pcVar9 < pcVar7 && (*pcVar9 != ' ')); pcVar9 = pcVar9 + 1) {
      lVar13 = lVar13 + -1;
    }
    if ((1U - lVar13 < 5) || (pcVar9 == pcVar7)) goto LAB_0012939d;
    end_address = (uint64_t)pcVar11;
    local_68 = pcVar8;
    if ((*pcVar11 == 'r') &&
       (bVar2 = ReadFromOffsetExact(local_4c,local_140,0x40,*local_48),
       bVar2 && local_140[0] == 0x464c457f)) {
      if (ehdr.e_ident._8_2_ == 2) {
        *local_58 = 0;
      }
      else if (ehdr.e_ident._8_2_ == 3) {
        *local_58 = *local_48;
        uVar12 = (ulong)(ushort)ehdr.e_flags;
        EVar10 = ehdr.e_entry;
        while (bVar2 = uVar12 != 0, uVar12 = uVar12 - 1, bVar2) {
          bVar2 = ReadFromOffsetExact(local_4c,&ehdr.e_phnum,0x38,*local_48 + EVar10);
          if ((bVar2 && ehdr._56_4_ == 1) && (file_offset == 0)) {
            *local_58 = *local_48 - local_f0;
            break;
          }
          EVar10 = EVar10 + 0x38;
        }
      }
    }
    pcVar8 = local_60;
  } while ((((local_80 < *local_48) || (local_90 <= local_80)) || (*(char *)end_address != 'r')) ||
          (local_68[3] != 'x'));
  pcVar8 = GetHex(local_68 + (2 - lVar13),pcVar7,(uint64_t *)&ehdr.e_phnum);
  iVar4 = -1;
  iVar3 = iVar4;
  if ((pcVar8 != pcVar7) && (*pcVar8 == ' ')) {
    uVar5 = 0;
    do {
      while( true ) {
        pcVar8 = pcVar8 + 1;
        if (pcVar7 <= pcVar8) goto LAB_001296e5;
        if (*pcVar8 != ' ') break;
        uVar5 = uVar5 + 1;
      }
    } while (uVar5 < 2);
LAB_001296e5:
    if (pcVar8 != pcVar7) {
      do {
        iVar3 = open(pcVar8,0);
        if (-1 < iVar3) goto LAB_001293a1;
        piVar6 = __errno_location();
        pcVar7 = local_70;
        sVar1 = local_78;
      } while (*piVar6 == 4);
      strncpy(local_70,pcVar8,local_78);
      pcVar7[sVar1 - 1] = '\0';
      iVar3 = iVar4;
    }
  }
LAB_001293a1:
  anon_unknown_3::FileDescriptor::~FileDescriptor(&local_34);
LAB_001293aa:
  anon_unknown_3::FileDescriptor::~FileDescriptor(&local_38);
  return iVar3;
}

Assistant:

static ATTRIBUTE_NOINLINE int
OpenObjectFileContainingPcAndGetStartAddress(uint64_t pc,
                                             uint64_t &start_address,
                                             uint64_t &base_address,
                                             char *out_file_name,
                                             size_t out_file_name_size) {
  int object_fd;

  int maps_fd;
  NO_INTR(maps_fd = open("/proc/self/maps", O_RDONLY));
  FileDescriptor wrapped_maps_fd(maps_fd);
  if (wrapped_maps_fd.get() < 0) {
    return -1;
  }

  int mem_fd;
  NO_INTR(mem_fd = open("/proc/self/mem", O_RDONLY));
  FileDescriptor wrapped_mem_fd(mem_fd);
  if (wrapped_mem_fd.get() < 0) {
    return -1;
  }

  // Iterate over maps and look for the map containing the pc.  Then
  // look into the symbol tables inside.
  char buf[1024];  // Big enough for line of sane /proc/self/maps
  unsigned num_maps = 0;
  LineReader reader(wrapped_maps_fd.get(), buf, sizeof(buf), 0);
  while (true) {
    num_maps++;
    const char *cursor;
    const char *eol;
    if (!reader.ReadLine(&cursor, &eol)) {  // EOF or malformed line.
      return -1;
    }

    // Start parsing line in /proc/self/maps.  Here is an example:
    //
    // 08048000-0804c000 r-xp 00000000 08:01 2142121    /bin/cat
    //
    // We want start address (08048000), end address (0804c000), flags
    // (r-xp) and file name (/bin/cat).

    // Read start address.
    cursor = GetHex(cursor, eol, &start_address);
    if (cursor == eol || *cursor != '-') {
      return -1;  // Malformed line.
    }
    ++cursor;  // Skip '-'.

    // Read end address.
    uint64_t end_address;
    cursor = GetHex(cursor, eol, &end_address);
    if (cursor == eol || *cursor != ' ') {
      return -1;  // Malformed line.
    }
    ++cursor;  // Skip ' '.

    // Read flags.  Skip flags until we encounter a space or eol.
    const char * const flags_start = cursor;
    while (cursor < eol && *cursor != ' ') {
      ++cursor;
    }
    // We expect at least four letters for flags (ex. "r-xp").
    if (cursor == eol || cursor < flags_start + 4) {
      return -1;  // Malformed line.
    }

    // Determine the base address by reading ELF headers in process memory.
    ElfW(Ehdr) ehdr;
    // Skip non-readable maps.
    if (flags_start[0] == 'r' &&
        ReadFromOffsetExact(mem_fd, &ehdr, sizeof(ElfW(Ehdr)), start_address) &&
        memcmp(ehdr.e_ident, ELFMAG, SELFMAG) == 0) {
      switch (ehdr.e_type) {
        case ET_EXEC:
          base_address = 0;
          break;
        case ET_DYN:
          // Find the segment containing file offset 0. This will correspond
          // to the ELF header that we just read. Normally this will have
          // virtual address 0, but this is not guaranteed. We must subtract
          // the virtual address from the address where the ELF header was
          // mapped to get the base address.
          //
          // If we fail to find a segment for file offset 0, use the address
          // of the ELF header as the base address.
          base_address = start_address;
          for (unsigned i = 0; i != ehdr.e_phnum; ++i) {
            ElfW(Phdr) phdr;
            if (ReadFromOffsetExact(
                    mem_fd, &phdr, sizeof(phdr),
                    start_address + ehdr.e_phoff + i * sizeof(phdr)) &&
                phdr.p_type == PT_LOAD && phdr.p_offset == 0) {
              base_address = start_address - phdr.p_vaddr;
              break;
            }
          }
          break;
        default:
          // ET_REL or ET_CORE. These aren't directly executable, so they don't
          // affect the base address.
          break;
      }
    }

    // Check start and end addresses.
    if (!(start_address <= pc && pc < end_address)) {
      continue;  // We skip this map.  PC isn't in this map.
    }

   // Check flags.  We are only interested in "r*x" maps.
    if (flags_start[0] != 'r' || flags_start[2] != 'x') {
      continue;  // We skip this map.
    }
    ++cursor;  // Skip ' '.

    // Read file offset.
    uint64_t file_offset;
    cursor = GetHex(cursor, eol, &file_offset);
    if (cursor == eol || *cursor != ' ') {
      return -1;  // Malformed line.
    }
    ++cursor;  // Skip ' '.

    // Skip to file name.  "cursor" now points to dev.  We need to
    // skip at least two spaces for dev and inode.
    int num_spaces = 0;
    while (cursor < eol) {
      if (*cursor == ' ') {
        ++num_spaces;
      } else if (num_spaces >= 2) {
        // The first non-space character after skipping two spaces
        // is the beginning of the file name.
        break;
      }
      ++cursor;
    }
    if (cursor == eol) {
      return -1;  // Malformed line.
    }

    // Finally, "cursor" now points to file name of our interest.
    NO_INTR(object_fd = open(cursor, O_RDONLY));
    if (object_fd < 0) {
      // Failed to open object file.  Copy the object file name to
      // |out_file_name|.
      strncpy(out_file_name, cursor, out_file_name_size);
      // Making sure |out_file_name| is always null-terminated.
      out_file_name[out_file_name_size - 1] = '\0';
      return -1;
    }
    return object_fd;
  }
}